

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::Pxr24Compressor::Pxr24Compressor
          (Pxr24Compressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines)

{
  Header *pHVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  _func_int **pp_Var4;
  Box2i *pBVar5;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Header *in_RSI;
  Compressor *in_RDI;
  undefined1 auVar6 [16];
  Box2i *dataWindow;
  size_t maxOutBytes;
  size_t maxInBytes;
  unsigned_long in_stack_ffffffffffffff78;
  unsigned_long in_stack_ffffffffffffff80;
  
  Compressor::Compressor(in_RDI,in_RSI);
  in_RDI->_vptr_Compressor = (_func_int **)&PTR__Pxr24Compressor_0040d9e0;
  *(undefined4 *)&in_RDI[1]._vptr_Compressor = in_EDX;
  *(undefined4 *)((long)&in_RDI[1]._vptr_Compressor + 4) = in_ECX;
  in_RDI[1]._header = (Header *)0x0;
  in_RDI[2]._vptr_Compressor = (_func_int **)0x0;
  pHVar1 = (Header *)Header::channels((Header *)0x1b8fa8);
  in_RDI[2]._header = pHVar1;
  uVar2 = uiMult<unsigned_long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  auVar6._8_4_ = (int)(uVar2 >> 0x20);
  auVar6._0_8_ = uVar2;
  auVar6._12_4_ = 0x45300000;
  ceil(((auVar6._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 0.01);
  uiAdd<unsigned_long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  uVar3 = uiAdd<unsigned_long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pHVar1 = (Header *)operator_new__(uVar2);
  in_RDI[1]._header = pHVar1;
  pp_Var4 = (_func_int **)operator_new__(uVar3);
  in_RDI[2]._vptr_Compressor = pp_Var4;
  pBVar5 = Header::dataWindow((Header *)0x1b90c3);
  *(int *)&in_RDI[3]._vptr_Compressor = (pBVar5->min).x;
  *(int *)((long)&in_RDI[3]._vptr_Compressor + 4) = (pBVar5->max).x;
  *(int *)&in_RDI[3]._header = (pBVar5->max).y;
  return;
}

Assistant:

Pxr24Compressor::Pxr24Compressor (const Header &hdr,
				  size_t maxScanLineSize,
				  size_t numScanLines)
:
    Compressor (hdr),
    _maxScanLineSize (maxScanLineSize),
    _numScanLines (numScanLines),
    _tmpBuffer (0),
    _outBuffer (0),
    _channels (hdr.channels())
{
    size_t maxInBytes =
        uiMult (maxScanLineSize, numScanLines);

    size_t maxOutBytes =
        uiAdd (uiAdd (maxInBytes,
                      size_t (ceil (maxInBytes * 0.01))),
               size_t (100));

    _tmpBuffer = new unsigned char [maxInBytes];
    _outBuffer = new char [maxOutBytes];

    const Box2i &dataWindow = hdr.dataWindow();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;
}